

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SingularFieldHelper<16>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  undefined8 uVar1;
  uint8 *puVar2;
  undefined1 local_14 [4];
  
  PrimitiveTypeHelper<13>::Serialize(local_14,output);
  uVar1 = *field;
  if ((output->impl_).end_ <= output->cur_) {
    puVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar2;
  }
  puVar2 = output->cur_;
  *(undefined8 *)puVar2 = uVar1;
  output->cur_ = puVar2 + 8;
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }